

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescue.c
# Opt level: O0

int path_join(char *root,char *path,char **out)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t plen;
  size_t rlen;
  char **out_local;
  char *path_local;
  char *root_local;
  
  sVar1 = strlen(root);
  sVar2 = strlen(root);
  pcVar3 = (char *)malloc(sVar1 + sVar2 + 2);
  *out = pcVar3;
  if (root[sVar1 - 1] == '/') {
    strcpy(*out,root);
    strcpy(*out + sVar1,path);
  }
  else if (*path == '/') {
    strcpy(*out,path);
  }
  else {
    strcpy(*out,root);
    (*out)[sVar1] = '/';
    strcpy(*out + sVar1 + 1,path);
  }
  return 1;
}

Assistant:

int path_join(const char* root, const char* path, char** out) {

    size_t rlen = strlen(root);
    size_t plen = strlen(root);

    *out = (char*) malloc(sizeof(char) * (rlen + plen + 2));

    if (IS_PATH_DELIMITER(root[rlen - 1]))
    {
        strcpy(*out, root);
        strcpy(&((*out)[rlen]), path);
    } else if (IS_PATH_DELIMITER(path[0]))
    {
        strcpy(*out, path);
    }
    else {
        strcpy(*out, root);
        (*out)[rlen] = PATH_DELIMITER;
        strcpy(&((*out)[rlen + 1]), path);
    }

    return 1;

}